

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O2

int Fl_Text_Editor::kf_delete(int param_1,Fl_Text_Editor *e)

{
  uint *puVar1;
  int pos;
  Fl_Text_Buffer *this;
  uint uVar2;
  fd_set *in_RCX;
  fd_set *in_R8;
  timeval *in_R9;
  
  this = (e->super_Fl_Text_Display).mBuffer;
  if ((this->mPrimary).mSelected == false) {
    pos = (e->super_Fl_Text_Display).mCursorPos;
    uVar2 = Fl_Text_Buffer::next_char(this,pos);
    Fl_Text_Buffer::select
              ((e->super_Fl_Text_Display).mBuffer,pos,(fd_set *)(ulong)uVar2,in_RCX,in_R8,in_R9);
  }
  kill_selection(e);
  Fl_Text_Display::show_insert_position(&e->super_Fl_Text_Display);
  puVar1 = &(e->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.flags_;
  *(byte *)puVar1 = (byte)*puVar1 | 0x80;
  if (((e->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.when_ & 1) != 0) {
    Fl_Widget::do_callback((Fl_Widget *)e);
  }
  return 1;
}

Assistant:

int Fl_Text_Editor::kf_delete(int, Fl_Text_Editor* e) {
  if (!e->buffer()->selected()) {
    int p1 = e->insert_position();
    int p2 = e->buffer()->next_char(p1);
    e->buffer()->select(p1, p2);
  }

  kill_selection(e);
  e->show_insert_position();
  e->set_changed();
  if (e->when()&FL_WHEN_CHANGED) e->do_callback();
  return 1;
}